

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t wVar1;
  rar5 *rar_00;
  rar5 *rar;
  wchar_t ret;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  rar_00 = get_context(a);
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  if (((byte)(rar_00->file).field_0x20 >> 3 & 1) == 0) {
    if ((rar_00->skip_mode == L'\0') &&
       ((rar_00->file).unpacked_size < (rar_00->cstate).last_write_ptr)) {
      archive_set_error(&a->archive,0x16,"Unpacker has written too many bytes");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      wVar1 = use_data(rar_00,buff,size,offset);
      if (wVar1 == L'\0') {
        a_local._4_4_ = L'\0';
      }
      else if (((byte)(rar_00->file).field_0x20 >> 2 & 1) == 1) {
        a_local._4_4_ = L'\x01';
      }
      else {
        a_local._4_4_ = do_unpack(a,rar_00,buff,size,offset);
        if (a_local._4_4_ == L'\0') {
          if (((rar_00->file).bytes_remaining == 0) &&
             ((rar_00->cstate).last_write_ptr == (rar_00->file).unpacked_size)) {
            (rar_00->file).field_0x20 = (rar_00->file).field_0x20 & 0xfb | 4;
            a_local._4_4_ = verify_global_checksums(a);
          }
          else {
            a_local._4_4_ = L'\0';
          }
        }
      }
    }
  }
  else {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    a_local._4_4_ = L'\xffffffe7';
  }
  return a_local._4_4_;
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}